

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.h
# Opt level: O0

void __thiscall FIX::FileStoreFactory::~FileStoreFactory(FileStoreFactory *this)

{
  FileStoreFactory *this_local;
  
  *(undefined ***)this = &PTR__FileStoreFactory_0030bc10;
  SessionSettings::~SessionSettings(&this->m_settings);
  std::__cxx11::string::~string((string *)&this->m_path);
  MessageStoreFactory::~MessageStoreFactory(&this->super_MessageStoreFactory);
  return;
}

Assistant:

FileStoreFactory( const SessionSettings& settings )
: m_settings( settings ) {}